

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall r_exec::View::force_res(View *this,double value)

{
  Atom local_14 [4];
  
  r_code::Atom::Float((float)value);
  r_code::Atom::operator=((Atom *)&(this->super_View).field_0x38,local_14);
  r_code::Atom::~Atom(local_14);
  return;
}

Assistant:

void View::force_res(double value)
{
    code(VIEW_RES) = Atom::Float(value);
}